

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O0

int PKCS5_pbe2_decrypt_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,char *pass,size_t pass_len,CBS *param)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  EVP_CIPHER *cipher_00;
  uint8_t *salt_00;
  uint8_t *iv_00;
  size_t iv_len;
  undefined1 local_118 [8];
  CBS iv;
  CBS null;
  CBS prf;
  CBS alg_id;
  EVP_MD *md;
  uint64_t key_len;
  uint64_t iterations;
  CBS salt;
  CBS pbkdf2_params;
  EVP_CIPHER *cipher;
  CBS enc_obj;
  CBS enc_scheme;
  CBS kdf_obj;
  CBS kdf;
  CBS pbe_param;
  CBS *param_local;
  size_t pass_len_local;
  char *pass_local;
  EVP_CIPHER_CTX *ctx_local;
  pbe_suite *suite_local;
  
  iVar1 = CBS_get_asn1(param,(CBS *)&kdf.len,0x20000010);
  if (((((iVar1 == 0) || (sVar3 = CBS_len(param), sVar3 != 0)) ||
       (iVar1 = CBS_get_asn1((CBS *)&kdf.len,(CBS *)&kdf_obj.len,0x20000010), iVar1 == 0)) ||
      ((iVar1 = CBS_get_asn1((CBS *)&kdf.len,(CBS *)&enc_obj.len,0x20000010), iVar1 == 0 ||
       (sVar3 = CBS_len((CBS *)&kdf.len), sVar3 != 0)))) ||
     ((iVar1 = CBS_get_asn1((CBS *)&kdf_obj.len,(CBS *)&enc_scheme.len,6), iVar1 == 0 ||
      (iVar1 = CBS_get_asn1((CBS *)&enc_obj.len,(CBS *)&cipher,6), iVar1 == 0)))) {
    ERR_put_error(0x13,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                  ,0xba);
    suite_local._4_4_ = 0;
  }
  else {
    iVar1 = CBS_mem_equal((CBS *)&enc_scheme.len,kPBKDF2,9);
    if (iVar1 == 0) {
      ERR_put_error(0x13,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                    ,0xc0);
      suite_local._4_4_ = 0;
    }
    else {
      cipher_00 = (EVP_CIPHER *)cbs_to_cipher((CBS *)&cipher);
      if (cipher_00 == (EVP_CIPHER *)0x0) {
        ERR_put_error(0x13,0,0x7f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                      ,199);
        suite_local._4_4_ = 0;
      }
      else {
        iVar1 = CBS_get_asn1((CBS *)&kdf_obj.len,(CBS *)&salt.len,0x20000010);
        if (((iVar1 == 0) || (sVar3 = CBS_len((CBS *)&kdf_obj.len), sVar3 != 0)) ||
           ((iVar1 = CBS_get_asn1((CBS *)&salt.len,(CBS *)&iterations,4), iVar1 == 0 ||
            (iVar1 = CBS_get_asn1_uint64((CBS *)&salt.len,&key_len), iVar1 == 0)))) {
          ERR_put_error(0x13,0,0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                        ,0xd2);
          suite_local._4_4_ = 0;
        }
        else {
          iVar1 = pkcs12_iterations_acceptable(key_len);
          if (iVar1 == 0) {
            ERR_put_error(0x13,0,0x81,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                          ,0xd7);
            suite_local._4_4_ = 0;
          }
          else {
            iVar1 = CBS_peek_asn1_tag((CBS *)&salt.len,2);
            if (iVar1 != 0) {
              iVar1 = CBS_get_asn1_uint64((CBS *)&salt.len,(uint64_t *)&md);
              if (iVar1 == 0) {
                ERR_put_error(0x13,0,0x68,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                              ,0xe0);
                return 0;
              }
              uVar2 = EVP_CIPHER_key_length(cipher_00);
              if (md != (EVP_MD *)(ulong)uVar2) {
                ERR_put_error(0x13,0,0x7d,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                              ,0xe5);
                return 0;
              }
            }
            alg_id.len = (size_t)EVP_sha1();
            sVar3 = CBS_len((CBS *)&salt.len);
            if (sVar3 != 0) {
              iVar1 = CBS_get_asn1((CBS *)&salt.len,(CBS *)&prf.len,0x20000010);
              if (((iVar1 == 0) ||
                  (iVar1 = CBS_get_asn1((CBS *)&prf.len,(CBS *)&null.len,6), iVar1 == 0)) ||
                 (sVar3 = CBS_len((CBS *)&salt.len), sVar3 != 0)) {
                ERR_put_error(0x13,0,0x68,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                              ,0xf0);
                return 0;
              }
              iVar1 = CBS_mem_equal((CBS *)&null.len,kHMACWithSHA1,8);
              if (iVar1 == 0) {
                iVar1 = CBS_mem_equal((CBS *)&null.len,kHMACWithSHA256,8);
                if (iVar1 == 0) {
                  ERR_put_error(0x13,0,0x82,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                                ,0xfb);
                  return 0;
                }
                alg_id.len = (size_t)EVP_sha256();
              }
              else {
                alg_id.len = (size_t)EVP_sha1();
              }
              iVar1 = CBS_get_asn1((CBS *)&prf.len,(CBS *)&iv.len,5);
              if (((iVar1 == 0) || (sVar3 = CBS_len((CBS *)&iv.len), sVar3 != 0)) ||
                 (sVar3 = CBS_len((CBS *)&prf.len), sVar3 != 0)) {
                ERR_put_error(0x13,0,0x68,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                              ,0x104);
                return 0;
              }
            }
            iVar1 = CBS_get_asn1((CBS *)&enc_obj.len,(CBS *)local_118,4);
            if ((iVar1 == 0) || (sVar3 = CBS_len((CBS *)&enc_obj.len), sVar3 != 0)) {
              ERR_put_error(0x13,0,0x82,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                            ,0x110);
              suite_local._4_4_ = 0;
            }
            else {
              salt_00 = CBS_data((CBS *)&iterations);
              sVar3 = CBS_len((CBS *)&iterations);
              iv_00 = CBS_data((CBS *)local_118);
              iv_len = CBS_len((CBS *)local_118);
              suite_local._4_4_ =
                   pkcs5_pbe2_cipher_init
                             (ctx,(EVP_CIPHER *)cipher_00,(EVP_MD *)alg_id.len,(uint32_t)key_len,
                              pass,pass_len,salt_00,sVar3,iv_00,iv_len,0);
            }
          }
        }
      }
    }
  }
  return suite_local._4_4_;
}

Assistant:

int PKCS5_pbe2_decrypt_init(const struct pbe_suite *suite, EVP_CIPHER_CTX *ctx,
                            const char *pass, size_t pass_len, CBS *param) {
  CBS pbe_param, kdf, kdf_obj, enc_scheme, enc_obj;
  if (!CBS_get_asn1(param, &pbe_param, CBS_ASN1_SEQUENCE) ||
      CBS_len(param) != 0 ||
      !CBS_get_asn1(&pbe_param, &kdf, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pbe_param, &enc_scheme, CBS_ASN1_SEQUENCE) ||
      CBS_len(&pbe_param) != 0 ||
      !CBS_get_asn1(&kdf, &kdf_obj, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(&enc_scheme, &enc_obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  // Only PBKDF2 is supported.
  if (!CBS_mem_equal(&kdf_obj, kPBKDF2, sizeof(kPBKDF2))) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEY_DERIVATION_FUNCTION);
    return 0;
  }

  // See if we recognise the encryption algorithm.
  const EVP_CIPHER *cipher = cbs_to_cipher(&enc_obj);
  if (cipher == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
    return 0;
  }

  // Parse the KDF parameters. See RFC 8018, appendix A.2.
  CBS pbkdf2_params, salt;
  uint64_t iterations;
  if (!CBS_get_asn1(&kdf, &pbkdf2_params, CBS_ASN1_SEQUENCE) ||
      CBS_len(&kdf) != 0 ||
      !CBS_get_asn1(&pbkdf2_params, &salt, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1_uint64(&pbkdf2_params, &iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  if (!pkcs12_iterations_acceptable(iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  // The optional keyLength parameter, if present, must match the key length of
  // the cipher.
  if (CBS_peek_asn1_tag(&pbkdf2_params, CBS_ASN1_INTEGER)) {
    uint64_t key_len;
    if (!CBS_get_asn1_uint64(&pbkdf2_params, &key_len)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (key_len != EVP_CIPHER_key_length(cipher)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEYLENGTH);
      return 0;
    }
  }

  const EVP_MD *md = EVP_sha1();
  if (CBS_len(&pbkdf2_params) != 0) {
    CBS alg_id, prf;
    if (!CBS_get_asn1(&pbkdf2_params, &alg_id, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&alg_id, &prf, CBS_ASN1_OBJECT) ||
        CBS_len(&pbkdf2_params) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (CBS_mem_equal(&prf, kHMACWithSHA1, sizeof(kHMACWithSHA1))) {
      // hmacWithSHA1 is the DEFAULT, so DER requires it be omitted, but we
      // match OpenSSL in tolerating it being present.
      md = EVP_sha1();
    } else if (CBS_mem_equal(&prf, kHMACWithSHA256, sizeof(kHMACWithSHA256))) {
      md = EVP_sha256();
    } else {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
      return 0;
    }

    // All supported PRFs use a NULL parameter.
    CBS null;
    if (!CBS_get_asn1(&alg_id, &null, CBS_ASN1_NULL) ||
        CBS_len(&null) != 0 ||
        CBS_len(&alg_id) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }
  }

  // Parse the encryption scheme parameters. Note OpenSSL does not match the
  // specification. Per RFC 2898, this should depend on the encryption scheme.
  // In particular, RC2-CBC uses a SEQUENCE with version and IV. We align with
  // OpenSSL.
  CBS iv;
  if (!CBS_get_asn1(&enc_scheme, &iv, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&enc_scheme) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
    return 0;
  }

  return pkcs5_pbe2_cipher_init(ctx, cipher, md, (uint32_t)iterations, pass,
                                pass_len, CBS_data(&salt), CBS_len(&salt),
                                CBS_data(&iv), CBS_len(&iv), 0 /* decrypt */);
}